

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O2

uint32_t JenkinsOOAT(char *key,int len,uint32_t hash)

{
  byte *pbVar1;
  uint uVar2;
  
  pbVar1 = (byte *)(key + len);
  for (; uVar2 = hash * 0x401 >> 6 ^ hash * 0x401, key < pbVar1; key = (char *)((byte *)key + 1)) {
    hash = uVar2 + (byte)*key;
  }
  uVar2 = uVar2 * 0x401;
  uVar2 = (uVar2 >> 6 ^ uVar2) * 0x401;
  uVar2 = (uVar2 >> 6 ^ uVar2) * 0x401;
  uVar2 = (uVar2 >> 6 ^ uVar2) * 0x401;
  uVar2 = (uVar2 >> 6 ^ uVar2) * 9;
  return (uVar2 >> 0xb ^ uVar2) * 0x8001;
}

Assistant:

uint32_t
JenkinsOOAT(const char *key, int len, uint32_t hash)
{
  unsigned char  *str = (unsigned char *)key;
  const unsigned char *const end = (const unsigned char *)str + len;
  uint64_t	  s = (uint64_t) hash;
  unsigned char  *seed = (unsigned char *)&s;
  //unsigned char seed[8];
  //note that perl5 adds the seed to the end of key, which looks like cargo cult
  while (str < end) {
    hash += (hash << 10);
    hash ^= (hash >> 6);
    hash += *str++;
  }

  hash += (hash << 10);
  hash ^= (hash >> 6);
  hash += seed[4];

  hash += (hash << 10);
  hash ^= (hash >> 6);
  hash += seed[5];

  hash += (hash << 10);
  hash ^= (hash >> 6);
  hash += seed[6];

  hash += (hash << 10);
  hash ^= (hash >> 6);
  hash += seed[7];

  hash += (hash << 10);
  hash ^= (hash >> 6);

  hash += (hash << 3);
  hash ^= (hash >> 11);
  hash = hash + (hash << 15);

  return hash;
}